

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  int iVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar2;
  undefined8 *puVar3;
  Extension *pEVar4;
  LogMessage *pLVar5;
  LogFinisher local_49;
  LogMessage local_48;
  
  pEVar4 = FindOrNull(this,number);
  if (pEVar4 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,799);
    pLVar5 = LogMessage::operator<<(&local_48,"CHECK failed: extension != NULL: ");
    pLVar5 = LogMessage::operator<<(pLVar5,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_49,pLVar5);
    LogMessage::~LogMessage(&local_48);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4)) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    ((pEVar4->field_0).repeated_int32_value)->current_size_ =
         ((pEVar4->field_0).repeated_int32_value)->current_size_ + -1;
    break;
  case 9:
    pRVar2 = (pEVar4->field_0).repeated_string_value;
    iVar1 = (pRVar2->super_RepeatedPtrFieldBase).current_size_;
    (pRVar2->super_RepeatedPtrFieldBase).current_size_ = iVar1 + -1;
    puVar3 = (undefined8 *)((pRVar2->super_RepeatedPtrFieldBase).rep_)->elements[(long)iVar1 + -1];
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
    break;
  case 10:
    pRVar2 = (pEVar4->field_0).repeated_string_value;
    iVar1 = (pRVar2->super_RepeatedPtrFieldBase).current_size_;
    (pRVar2->super_RepeatedPtrFieldBase).current_size_ = iVar1 + -1;
    (**(code **)(*((pRVar2->super_RepeatedPtrFieldBase).rep_)->elements[(long)iVar1 + -1] + 0x38))()
    ;
  }
  return;
}

Assistant:

void ExtensionSet::RemoveLast(int number) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->RemoveLast();
      break;
  }
}